

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInputSetup.cpp
# Opt level: O1

void __thiscall
uInputPlus::uInputDeviceInfo::uInputDeviceInfo
          (uInputDeviceInfo *this,string *name,uint16_t bus_type,uint16_t vid,uint16_t pid,
          uint16_t version)

{
  size_t __n;
  
  (this->usetup).id.bustype = 0;
  (this->usetup).id.vendor = 0;
  (this->usetup).id.product = 0;
  (this->usetup).id.version = 0;
  (this->usetup).name[0] = '\0';
  (this->usetup).name[1] = '\0';
  (this->usetup).name[2] = '\0';
  (this->usetup).name[3] = '\0';
  (this->usetup).name[4] = '\0';
  (this->usetup).name[5] = '\0';
  (this->usetup).name[6] = '\0';
  (this->usetup).name[7] = '\0';
  (this->usetup).name[0x44] = '\0';
  (this->usetup).name[0x45] = '\0';
  (this->usetup).name[0x46] = '\0';
  (this->usetup).name[0x47] = '\0';
  (this->usetup).name[0x48] = '\0';
  (this->usetup).name[0x49] = '\0';
  (this->usetup).name[0x4a] = '\0';
  (this->usetup).name[0x4b] = '\0';
  *(undefined8 *)((this->usetup).name + 0x4c) = 0;
  (this->usetup).name[0x38] = '\0';
  (this->usetup).name[0x39] = '\0';
  (this->usetup).name[0x3a] = '\0';
  (this->usetup).name[0x3b] = '\0';
  (this->usetup).name[0x3c] = '\0';
  (this->usetup).name[0x3d] = '\0';
  (this->usetup).name[0x3e] = '\0';
  (this->usetup).name[0x3f] = '\0';
  (this->usetup).name[0x40] = '\0';
  (this->usetup).name[0x41] = '\0';
  (this->usetup).name[0x42] = '\0';
  (this->usetup).name[0x43] = '\0';
  (this->usetup).name[0x44] = '\0';
  (this->usetup).name[0x45] = '\0';
  (this->usetup).name[0x46] = '\0';
  (this->usetup).name[0x47] = '\0';
  (this->usetup).name[0x28] = '\0';
  (this->usetup).name[0x29] = '\0';
  (this->usetup).name[0x2a] = '\0';
  (this->usetup).name[0x2b] = '\0';
  (this->usetup).name[0x2c] = '\0';
  (this->usetup).name[0x2d] = '\0';
  (this->usetup).name[0x2e] = '\0';
  (this->usetup).name[0x2f] = '\0';
  (this->usetup).name[0x30] = '\0';
  (this->usetup).name[0x31] = '\0';
  (this->usetup).name[0x32] = '\0';
  (this->usetup).name[0x33] = '\0';
  (this->usetup).name[0x34] = '\0';
  (this->usetup).name[0x35] = '\0';
  (this->usetup).name[0x36] = '\0';
  (this->usetup).name[0x37] = '\0';
  (this->usetup).name[0x18] = '\0';
  (this->usetup).name[0x19] = '\0';
  (this->usetup).name[0x1a] = '\0';
  (this->usetup).name[0x1b] = '\0';
  (this->usetup).name[0x1c] = '\0';
  (this->usetup).name[0x1d] = '\0';
  (this->usetup).name[0x1e] = '\0';
  (this->usetup).name[0x1f] = '\0';
  (this->usetup).name[0x20] = '\0';
  (this->usetup).name[0x21] = '\0';
  (this->usetup).name[0x22] = '\0';
  (this->usetup).name[0x23] = '\0';
  (this->usetup).name[0x24] = '\0';
  (this->usetup).name[0x25] = '\0';
  (this->usetup).name[0x26] = '\0';
  (this->usetup).name[0x27] = '\0';
  (this->usetup).name[8] = '\0';
  (this->usetup).name[9] = '\0';
  (this->usetup).name[10] = '\0';
  (this->usetup).name[0xb] = '\0';
  (this->usetup).name[0xc] = '\0';
  (this->usetup).name[0xd] = '\0';
  (this->usetup).name[0xe] = '\0';
  (this->usetup).name[0xf] = '\0';
  (this->usetup).name[0x10] = '\0';
  (this->usetup).name[0x11] = '\0';
  (this->usetup).name[0x12] = '\0';
  (this->usetup).name[0x13] = '\0';
  (this->usetup).name[0x14] = '\0';
  (this->usetup).name[0x15] = '\0';
  (this->usetup).name[0x16] = '\0';
  (this->usetup).name[0x17] = '\0';
  this->BusType = (uint16_t *)this;
  this->Vendor = &(this->usetup).id.vendor;
  this->Product = &(this->usetup).id.product;
  this->Version = &(this->usetup).id.version;
  (this->usetup).id.bustype = bus_type;
  (this->usetup).id.vendor = vid;
  (this->usetup).id.product = pid;
  (this->usetup).id.version = version;
  __n = 0x4f;
  if (name->_M_string_length < 0x4f) {
    __n = name->_M_string_length;
  }
  memcpy((this->usetup).name,(name->_M_dataplus)._M_p,__n);
  (this->usetup).name[__n] = '\0';
  return;
}

Assistant:

uInputDeviceInfo::uInputDeviceInfo(const std::string &name, uint16_t bus_type, uint16_t vid, uint16_t pid, uint16_t version) {
	BusType = bus_type;
	Vendor = vid;
	Product = pid;
	Version = version;
	set_name(name);
}